

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

size_t length_until_line_feed(char *token,size_t n)

{
  ulong local_20;
  size_t len;
  size_t n_local;
  char *token_local;
  
  for (local_20 = 0; ((local_20 < n && (token[local_20] != '\n')) && (token[local_20] != '\r'));
      local_20 = local_20 + 1) {
  }
  return local_20;
}

Assistant:

static size_t length_until_line_feed(const char *token, size_t n) {
  size_t len = 0;

  /* Assume token[n-1] = '\0' */
  for (len = 0; len < n; len++) {
    if ((token[len] == '\n') || (token[len] == '\r')) {
      break;
    }
  }

  return len;
}